

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<kj::CidrRange>::dispose(ArrayBuilder<kj::CidrRange> *this)

{
  CidrRange *firstElement;
  RemoveConst<kj::CidrRange> *pRVar1;
  CidrRange *pCVar2;
  CidrRange *endCopy;
  CidrRange *posCopy;
  CidrRange *ptrCopy;
  ArrayBuilder<kj::CidrRange> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pCVar2 = this->endPtr;
  if (firstElement != (CidrRange *)0x0) {
    this->ptr = (CidrRange *)0x0;
    this->pos = (RemoveConst<kj::CidrRange> *)0x0;
    this->endPtr = (CidrRange *)0x0;
    ArrayDisposer::dispose<kj::CidrRange>
              (this->disposer,firstElement,((long)pRVar1 - (long)firstElement) / 0x18,
               ((long)pCVar2 - (long)firstElement) / 0x18);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }